

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void tiocapture(tiocxdef *tioctx,mcmcxdef *memctx,int flag)

{
  mcmcxdef *pmVar1;
  
  pmVar1 = G_std_disp.capture_ctx;
  if ((flag != 0) && (pmVar1 = memctx, G_std_disp.capture_obj == 0xffff)) {
    mcmalo0(memctx,0x100,&G_std_disp.capture_obj,0xffff,0);
    mcmunlck(memctx,G_std_disp.capture_obj);
    pmVar1 = memctx;
  }
  G_std_disp.capture_ctx = pmVar1;
  G_std_disp.capturing = flag;
  G_log_disp.capturing = flag;
  return;
}

Assistant:

void tiocapture(tiocxdef *tioctx, mcmcxdef *memctx, int flag)
{
    if (flag)
    {
        /* create a new object if necessary */
        if (G_std_disp.capture_obj == MCMONINV)
        {
            mcmalo(memctx, 256, &G_std_disp.capture_obj);
            mcmunlck(memctx, G_std_disp.capture_obj);
        }

        /* remember the memory context */
        G_std_disp.capture_ctx = memctx;
    }

    /* 
     *   remember capture status in the standard output stream as well as
     *   the log stream 
     */
    G_std_disp.capturing = flag;
    G_log_disp.capturing = flag;
}